

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentPtr __thiscall
ON_SubDComponentPtr::SetComponentDirection(ON_SubDComponentPtr *this,ON__UINT_PTR dir)

{
  ON__UINT_PTR dir_local;
  ON_SubDComponentPtr *this_local;
  ON_SubDComponentPtr component_ptr;
  
  this_local = (ON_SubDComponentPtr *)this->m_ptr;
  if (dir == 0) {
    this_local = (ON_SubDComponentPtr *)((ulong)this_local & 0xfffffffffffffffe);
  }
  else if (dir == 1) {
    this_local = (ON_SubDComponentPtr *)((ulong)this_local | 1);
  }
  else {
    ON_SubDIncrementErrorCount();
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
               ,0x928,"","Invalid dir parameter");
  }
  return (ON_SubDComponentPtr)(ON__UINT_PTR)this_local;
}

Assistant:

const ON_SubDComponentPtr ON_SubDComponentPtr::SetComponentDirection(ON__UINT_PTR dir) const
{
  ON_SubDComponentPtr component_ptr = *this;
  if (0 == dir)
    component_ptr.m_ptr &= ~((ON__UINT_PTR)ON_SUBD_COMPONENT_DIRECTION_MASK);
  else if (1 == dir)
    component_ptr.m_ptr |= ON_SUBD_COMPONENT_DIRECTION_MASK;
  else
    ON_SUBD_ERROR("Invalid dir parameter");
  return component_ptr;
}